

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFinalize(Mem *pMem,FuncDef *pFunc)

{
  void *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Mem t;
  sqlite3_context ctx;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  u32 uStack_4c;
  u64 local_48;
  undefined4 *local_40 [4];
  int local_1c;
  char local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_40,0xaa,0x38);
  memcpy(&local_78,&DAT_002aabf0,0x38);
  memset(local_40,0,0x38);
  memset(&local_78,0,0x38);
  uStack_64 = CONCAT22(uStack_64._2_2_,1);
  uStack_60 = in_RDI->mutex;
  local_40[0] = &local_78;
  local_18 = uStack_60[2].mutex.__size[0x14];
  (**(code **)((long)in_RSI + 0x20))(local_40);
  if (0 < *(int *)&in_RDI->aDb) {
    sqlite3DbFreeNN(in_RDI,in_RSI);
  }
  in_RDI->flags = local_48;
  *(undefined4 *)&in_RDI->aDb = local_58;
  *(undefined4 *)((long)&in_RDI->aDb + 4) = uStack_54;
  in_RDI->nDb = iStack_50;
  in_RDI->mDbFlags = uStack_4c;
  *(undefined4 *)&in_RDI->pDfltColl = local_68;
  *(undefined4 *)((long)&in_RDI->pDfltColl + 4) = uStack_64;
  *(undefined4 *)&in_RDI->mutex = (undefined4)uStack_60;
  *(undefined4 *)((long)&in_RDI->mutex + 4) = uStack_60._4_4_;
  *(undefined4 *)&in_RDI->pVfs = local_78;
  *(undefined4 *)((long)&in_RDI->pVfs + 4) = uStack_74;
  *(undefined4 *)&in_RDI->pVdbe = uStack_70;
  *(undefined4 *)((long)&in_RDI->pVdbe + 4) = uStack_6c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFinalize(Mem *pMem, FuncDef *pFunc){
  sqlite3_context ctx;
  Mem t;
  assert( pFunc!=0 );
  assert( pMem!=0 );
  assert( pMem->db!=0 );
  assert( pFunc->xFinalize!=0 );
  assert( (pMem->flags & MEM_Null)!=0 || pFunc==pMem->u.pDef );
  assert( sqlite3_mutex_held(pMem->db->mutex) );
  memset(&ctx, 0, sizeof(ctx));
  memset(&t, 0, sizeof(t));
  t.flags = MEM_Null;
  t.db = pMem->db;
  ctx.pOut = &t;
  ctx.pMem = pMem;
  ctx.pFunc = pFunc;
  ctx.enc = ENC(t.db);
  pFunc->xFinalize(&ctx); /* IMP: R-24505-23230 */
  assert( (pMem->flags & MEM_Dyn)==0 );
  if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
  memcpy(pMem, &t, sizeof(t));
  return ctx.isError;
}